

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::InitGoogleMockImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  char *str;
  int local_48;
  int j;
  char *arg;
  String arg_string;
  int i;
  char **argv_local;
  int *argc_local;
  
  InitGoogleTest(argc,argv);
  if (0 < *argc) {
    for (arg_string.length_._4_4_ = 1; arg_string.length_._4_4_ != *argc;
        arg_string.length_._4_4_ = arg_string.length_._4_4_ + 1) {
      StreamableToString<char*>((internal *)&arg,argv + arg_string.length_._4_4_);
      str = String::c_str((String *)&arg);
      bVar1 = ParseGoogleMockBoolFlag
                        (str,"catch_leaked_mocks",(bool *)&FLAGS_gmock_catch_leaked_mocks);
      if ((bVar1) ||
         (bVar1 = ParseGoogleMockStringFlag(str,"verbose",(String *)FLAGS_gmock_verbose), bVar1)) {
        for (local_48 = arg_string.length_._4_4_; local_48 != *argc; local_48 = local_48 + 1) {
          argv[local_48] = argv[local_48 + 1];
        }
        *argc = *argc + -1;
        arg_string.length_._4_4_ = arg_string.length_._4_4_ + -1;
      }
      String::~String((String *)&arg);
    }
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const String arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    if (ParseGoogleMockBoolFlag(arg, "catch_leaked_mocks",
                                &GMOCK_FLAG(catch_leaked_mocks)) ||
        ParseGoogleMockStringFlag(arg, "verbose", &GMOCK_FLAG(verbose))) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}